

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_merge.hpp
# Opt level: O1

void __thiscall
optimization::const_merge::Env::add_usepoint(Env *this,VarId *var,LabelId labelId,int idx)

{
  size_type sVar1;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *this_01;
  pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_48;
  
  this_01 = &this->usepoints;
  sVar1 = std::
          map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          ::count(this_01,var);
  if (sVar1 == 0) {
    local_48.first.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001ee058;
    local_48.first.id = var->id;
    local_48.second.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.second.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.second.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
    ::
    _M_insert_unique<std::pair<mir::inst::VarId_const,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::_Select1st<std::pair<mir::inst::VarId_const,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
                *)this_01,&local_48);
    if (local_48.second.
        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.second.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.second.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.second.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  this_00 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
            std::
            map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
            ::at(this_01,var);
  local_48.first.super_Displayable._vptr_Displayable._4_4_ = idx;
  local_48.first.super_Displayable._vptr_Displayable._0_4_ = labelId;
  std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
  emplace_back<std::pair<int,int>>(this_00,(pair<int,_int> *)&local_48);
  return;
}

Assistant:

void add_usepoint(mir::inst::VarId var, mir::types::LabelId labelId,
                    int idx) {
    if (!usepoints.count(var)) {
      usepoints.insert(
          {var, std::vector<std::pair<mir::types::LabelId, int>>()});
    }
    usepoints.at(var).push_back({labelId, idx});
  }